

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::walkStacklessQuantizedTree
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax,
          int startNodeIndex,int endNodeIndex)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  cbtQuantizedBvhNode *pcVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  iVar6 = 0;
  if (startNodeIndex < endNodeIndex) {
    iVar6 = 0;
    pcVar5 = (this->m_quantizedContiguousNodes).m_data + startNodeIndex;
    do {
      bVar2 = *quantizedQueryAabbMin <= pcVar5->m_quantizedAabbMax[0];
      bVar7 = pcVar5->m_quantizedAabbMin[0] <= *quantizedQueryAabbMax;
      bVar3 = quantizedQueryAabbMin[2] <= pcVar5->m_quantizedAabbMax[2];
      bVar8 = pcVar5->m_quantizedAabbMin[2] <= quantizedQueryAabbMax[2];
      uVar1 = pcVar5->m_escapeIndexOrTriangleIndex;
      bVar4 = quantizedQueryAabbMin[1] <= pcVar5->m_quantizedAabbMax[1];
      bVar9 = pcVar5->m_quantizedAabbMin[1] <= quantizedQueryAabbMax[1];
      if (((int)uVar1 < 0) || ((!bVar9 || !bVar4) || ((!bVar8 || !bVar7) || (!bVar3 || !bVar2)))) {
        if (!(bool)(~((bVar9 && bVar4) && ((bVar8 && bVar7) && (bVar3 && bVar2))) & (int)uVar1 < 0))
        goto LAB_008a7044;
        startNodeIndex = startNodeIndex - uVar1;
        pcVar5 = pcVar5 + -uVar1;
      }
      else {
        (*nodeCallback->_vptr_cbtNodeOverlapCallback[2])
                  (nodeCallback,(ulong)(uVar1 >> 0x15),(ulong)(uVar1 & 0x1fffff));
LAB_008a7044:
        pcVar5 = pcVar5 + 1;
        startNodeIndex = startNodeIndex + 1;
      }
      iVar6 = iVar6 + 1;
    } while (startNodeIndex < endNodeIndex);
  }
  if (maxIterations < iVar6) {
    maxIterations = iVar6;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessQuantizedTree(cbtNodeOverlapCallback* nodeCallback, unsigned short int* quantizedQueryAabbMin, unsigned short int* quantizedQueryAabbMax, int startNodeIndex, int endNodeIndex) const
{
	cbtAssert(m_useQuantization);

	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const cbtQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;

	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < endNodeIndex)
	{
//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern cbtIDebugDraw* debugDrawerPtr;
		if (curIndex == drawPatch)
		{
			cbtVector3 aabbMin, aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			cbtVector3 color(1, 0, 0);
			debugDrawerPtr->drawAabb(aabbMin, aabbMax, color);
		}
#endif  //VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		cbtAssert(walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, rootNode->m_quantizedAabbMin, rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();

		if (isLeafNode && aabbOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(), rootNode->getTriangleIndex());
		}

		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}